

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

VectorType * __thiscall
LLVMBC::LLVMContext::construct<LLVMBC::VectorType,LLVMBC::LLVMContext&,unsigned_int&,LLVMBC::Type*&>
          (LLVMContext *this,LLVMContext *u,uint *u_1,Type **u_2)

{
  VectorType *this_00;
  VectorType *t;
  VectorType *mem;
  Type **u_local_2;
  uint *u_local_1;
  LLVMContext *u_local;
  LLVMContext *this_local;
  
  this_00 = (VectorType *)allocate(this,0x20,8);
  if (this_00 == (VectorType *)0x0) {
    std::terminate();
  }
  VectorType::VectorType(this_00,u,*u_1,*u_2);
  return this_00;
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}